

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::~HeapInfo(HeapInfo *this)

{
  LargeHeapBucket *this_00;
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this_01
  ;
  long lVar5;
  SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_02;
  
  GetSmallHeapBlockCount(this,true);
  lVar5 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::FinalizeAllObjects
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar5));
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0xa878);
  lVar5 = 0xa878;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::FinalizeAllObjects
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar5));
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0x10df8);
  this_00 = &this->largeObjectBucket;
  LargeHeapBucket::FinalizeAllObjects(this_00);
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  ::FinalizeHeapBlockList(this->newFinalizableHeapBlockList);
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  ::FinalizeHeapBlockList(this->newMediumFinalizableHeapBlockList);
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  ::FinalizeHeapBlockList(this->newFinalizableWithBarrierHeapBlockList);
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::FinalizeHeapBlockList(this->newMediumFinalizableWithBarrierHeapBlockList);
  if (this->liveFinalizableObjectCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x211,"(liveFinalizableObjectCount == 0)","liveFinalizableObjectCount == 0")
    ;
    if (!bVar2) goto LAB_006dffe8;
    *puVar3 = 0;
  }
  if (this->pendingDisposableObjectCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x212,"(pendingDisposableObjectCount == 0)",
                       "pendingDisposableObjectCount == 0");
    if (!bVar2) goto LAB_006dffe8;
    *puVar3 = 0;
  }
  recycler = this->recycler;
  sVar4 = LargeHeapBucket::GetLargeHeapBlockCount(this_00,false);
  if (this->heapBlockCount[0xb] != sVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x223,
                       "(this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType] - largeBlockCount - mediumBlockCount == 0)"
                       ,
                       "this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType] - largeBlockCount - mediumBlockCount == 0"
                      );
    if (!bVar2) {
LAB_006dffe8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::DeleteHeapBlockList
            (this->newLeafHeapBlockList,recycler);
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::DeleteHeapBlockList
            (this->newNormalHeapBlockList,recycler);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  DeleteHeapBlockList(this->newNormalWithBarrierHeapBlockList,recycler);
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  DeleteHeapBlockList(this->newFinalizableWithBarrierHeapBlockList,recycler);
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
  DeleteHeapBlockList(this->newFinalizableHeapBlockList,recycler);
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::DeleteHeapBlockList
            (this->newMediumLeafHeapBlockList,recycler);
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::DeleteHeapBlockList
            (this->newMediumNormalHeapBlockList,recycler);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  DeleteHeapBlockList(this->newMediumNormalWithBarrierHeapBlockList,recycler);
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  DeleteHeapBlockList(this->newMediumFinalizableWithBarrierHeapBlockList,recycler);
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
  DeleteHeapBlockList(this->newMediumFinalizableHeapBlockList,recycler);
  RecyclerMemoryTracking::ReportRecyclerDestroy(recycler);
  (this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  _vptr_PageAllocatorBase = (_func_int **)&PTR_SetDisableThreadAccessCheck_014d93a8;
  CCLock::~CCLock(&(this->recyclerLargeBlockPageAllocator).zeroPageQueue.super_BackgroundPageQueue.
                   backgroundPageQueueCriticalSection.super_CCLock);
  (this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  _vptr_PageAllocatorBase = (_func_int **)&PTR_SetDisableThreadAccessCheck_014d9408;
  CCLock::~CCLock(&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.cs.
                   super_CCLock);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&this->recyclerLargeBlockPageAllocator);
  (this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  _vptr_PageAllocatorBase = (_func_int **)&PTR_SetDisableThreadAccessCheck_014d93a8;
  CCLock::~CCLock(&(this->recyclerPageAllocator).zeroPageQueue.super_BackgroundPageQueue.
                   backgroundPageQueueCriticalSection.super_CCLock);
  (this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  _vptr_PageAllocatorBase = (_func_int **)&PTR_SetDisableThreadAccessCheck_014d9408;
  CCLock::~CCLock(&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator.cs.super_CCLock);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&this->recyclerPageAllocator);
  (this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  _vptr_PageAllocatorBase = (_func_int **)&PTR_SetDisableThreadAccessCheck_014d93a8;
  CCLock::~CCLock(&(this->recyclerWithBarrierPageAllocator).zeroPageQueue.super_BackgroundPageQueue.
                   backgroundPageQueueCriticalSection.super_CCLock);
  (this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  _vptr_PageAllocatorBase = (_func_int **)&PTR_SetDisableThreadAccessCheck_014d9408;
  CCLock::~CCLock(&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator.cs.
                   super_CCLock);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&this->recyclerWithBarrierPageAllocator);
  LargeHeapBucket::~LargeHeapBucket(this_00);
  this_02 = (SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
             *)(this->mediumHeapBuckets + 0x1c);
  lVar5 = -0x6580;
  do {
    SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
    ::~SmallFinalizableHeapBucketBaseT
              ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                *)(this_02 + 4));
    SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
    ::~SmallNormalHeapBucketBase
              ((SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                *)(this_02 + 3));
    SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
    ::~SmallFinalizableHeapBucketBaseT
              ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                *)&this_02[1].partialHeapBlockList);
    HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::~HeapBucketT
              ((HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *)
               (this_02 + 1));
    SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
    ~SmallNormalHeapBucketBase(this_02);
    this_02 = (SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
               *)&this_02[-6].partialHeapBlockList;
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0);
  this_01 = (SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
             *)(this->heapBuckets + 0x2f);
  lVar5 = -0xa800;
  do {
    SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
    ::~SmallFinalizableHeapBucketBaseT
              ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)(this_01 + 4));
    SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
    ::~SmallNormalHeapBucketBase
              ((SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)(this_01 + 3));
    SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
    ::~SmallFinalizableHeapBucketBaseT
              ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                *)&this_01[1].partialHeapBlockList);
    HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::~HeapBucketT
              ((HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *)
               (this_01 + 1));
    SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
    ~SmallNormalHeapBucketBase(this_01);
    this_01 = (SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
               *)&this_01[-6].partialHeapBlockList;
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0);
  return;
}

Assistant:

HeapInfo::~HeapInfo()
{
    RECYCLER_SLOW_CHECK(this->VerifySmallHeapBlockCount());

    // Finalize all finalizable object first
    for (uint i=0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].FinalizeAllObjects();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i=0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].FinalizeAllObjects();
    }
#endif

    largeObjectBucket.FinalizeAllObjects();

#if ENABLE_CONCURRENT_GC
    SmallFinalizableHeapBucket::FinalizeHeapBlockList(this->newFinalizableHeapBlockList);
    MediumFinalizableHeapBucket::FinalizeHeapBlockList(this->newMediumFinalizableHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    SmallRecyclerVisitedHostHeapBucket::FinalizeHeapBlockList(this->newRecyclerVisitedHostHeapBlockList);
    MediumRecyclerVisitedHostHeapBucket::FinalizeHeapBlockList(this->newMediumRecyclerVisitedHostHeapBlockList);
#endif
#ifdef RECYCLER_WRITE_BARRIER
    SmallFinalizableWithBarrierHeapBucket::FinalizeHeapBlockList(this->newFinalizableWithBarrierHeapBlockList);
    MediumFinalizableWithBarrierHeapBucket::FinalizeHeapBlockList(this->newMediumFinalizableWithBarrierHeapBlockList);
#endif
#endif

#ifdef RECYCLER_FINALIZE_CHECK
    Assert(liveFinalizableObjectCount == 0);
    Assert(pendingDisposableObjectCount == 0);
#endif
    // Delete the heap blocks
    Recycler * recycler = this->recycler;

#ifdef RECYCLER_SLOW_CHECK_ENABLED
    size_t largeBlockCount = this->largeObjectBucket.GetLargeHeapBlockCount(false);

    uint mediumBlockCount = 0;
#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && !SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumBlockCount += mediumHeapBuckets[i].GetLargeHeapBlockCount(false);
    }
#endif
#endif

    RECYCLER_SLOW_CHECK(Assert(this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType] - largeBlockCount - mediumBlockCount == 0));

#if ENABLE_CONCURRENT_GC
    SmallLeafHeapBucket::DeleteHeapBlockList(this->newLeafHeapBlockList, recycler);
    SmallNormalHeapBucket::DeleteHeapBlockList(this->newNormalHeapBlockList, recycler);
#ifdef RECYCLER_WRITE_BARRIER
    SmallNormalWithBarrierHeapBucket::DeleteHeapBlockList(this->newNormalWithBarrierHeapBlockList, recycler);
    SmallFinalizableWithBarrierHeapBucket::DeleteHeapBlockList(this->newFinalizableWithBarrierHeapBlockList, recycler);
#endif
    SmallFinalizableHeapBucket::DeleteHeapBlockList(this->newFinalizableHeapBlockList, recycler);

    MediumLeafHeapBucket::DeleteHeapBlockList(this->newMediumLeafHeapBlockList, recycler);
    MediumNormalHeapBucket::DeleteHeapBlockList(this->newMediumNormalHeapBlockList, recycler);
#ifdef RECYCLER_WRITE_BARRIER
    MediumNormalWithBarrierHeapBucket::DeleteHeapBlockList(this->newMediumNormalWithBarrierHeapBlockList, recycler);
    MediumFinalizableWithBarrierHeapBucket::DeleteHeapBlockList(this->newMediumFinalizableWithBarrierHeapBlockList, recycler);
#endif
    MediumFinalizableHeapBucket::DeleteHeapBlockList(this->newMediumFinalizableHeapBlockList, recycler);

#ifdef RECYCLER_VISITED_HOST
    SmallFinalizableHeapBucket::DeleteHeapBlockList(this->newRecyclerVisitedHostHeapBlockList, recycler);
    MediumFinalizableHeapBucket::DeleteHeapBlockList(this->newMediumRecyclerVisitedHostHeapBlockList, recycler);
#endif

#endif

    // We do this here, instead of in the Recycler destructor, because the above stuff may
    // generate additional tracking events, particularly ReportUnallocated.
    // Arguably we shouldn't report these things as ReportUnallocated...
    RecyclerMemoryTracking::ReportRecyclerDestroy(recycler);
}